

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pushDownWhereTerms(Parse *pParse,Select *pSubq,Expr *pWhere,SrcList *pSrcList,int iSrc)

{
  char cVar1;
  int iVar2;
  Expr *pEVar3;
  Expr *in_RCX;
  Select *in_RDX;
  Parse *in_RSI;
  int in_R8D;
  long in_FS_OFFSET;
  CollSeq *pColl;
  ExprList *pList;
  int ii;
  u8 op;
  int notUnionAll;
  Select *pSel;
  int nChng;
  SrcItem *pSrc;
  Expr *pNew;
  SubstContext x;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  sqlite3 *in_stack_ffffffffffffff60;
  Expr *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  Parse *local_80;
  undefined4 in_stack_ffffffffffffff88;
  Parse *pParse_00;
  undefined1 *puVar4;
  undefined4 in_stack_ffffffffffffffa0;
  int local_34;
  undefined1 local_30 [8];
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_20;
  undefined8 local_18;
  ExprList *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  puVar4 = &DAT_aaaaaaaaaaaaaaaa;
  local_34 = 0;
  pParse_00 = (Parse *)&in_RCX[in_R8D].u;
  if (in_RDX == (Select *)0x0) {
    local_34 = 0;
  }
  else if (((ulong)in_RSI->db & 0x200200000000000) == 0) {
    if (((ulong)*(anon_union_8_2_a01b6dbf_for_x *)((long)pParse_00 + 0x18) & 0x50) == 0) {
      if (in_RSI->aLabel == (int *)0x0) {
        if (((in_RSI->constraintName).z != (char *)0x0) &&
           (*(long *)((in_RSI->constraintName).z + 0x10) == 0)) {
          local_34 = 0;
          goto LAB_001e9b48;
        }
      }
      else {
        in_stack_ffffffffffffff7c = 0;
        for (local_80 = in_RSI; local_80 != (Parse *)0x0; local_80 = (Parse *)local_80->aLabel) {
          cVar1 = *(char *)&local_80->db;
          in_stack_ffffffffffffff78 = CONCAT13(cVar1,(int3)in_stack_ffffffffffffff78);
          if ((cVar1 != -0x78) && (cVar1 != -0x75)) {
            in_stack_ffffffffffffff7c = 1;
          }
          if ((local_80->constraintName).z != (char *)0x0) {
            local_34 = 0;
            goto LAB_001e9b48;
          }
        }
        local_80 = in_RSI;
        if (in_stack_ffffffffffffff7c != 0) {
          for (; local_80 != (Parse *)0x0; local_80 = (Parse *)local_80->aLabel) {
            in_stack_ffffffffffffff68 = *(Expr **)&local_80->isMultiWrite;
            for (in_stack_ffffffffffffff74 = 0; iVar2._0_1_ = in_stack_ffffffffffffff68->op,
                iVar2._1_1_ = in_stack_ffffffffffffff68->affExpr,
                iVar2._2_1_ = in_stack_ffffffffffffff68->op2,
                iVar2._3_1_ = in_stack_ffffffffffffff68->field_0x3,
                in_stack_ffffffffffffff74 < iVar2;
                in_stack_ffffffffffffff74 = in_stack_ffffffffffffff74 + 1) {
              in_stack_ffffffffffffff60 =
                   (sqlite3 *)
                   sqlite3ExprCollSeq(pParse_00,(Expr *)CONCAT44(local_34,in_stack_ffffffffffffff88)
                                     );
              iVar2 = sqlite3IsBinary((CollSeq *)in_stack_ffffffffffffff60);
              if (iVar2 == 0) {
                local_34 = 0;
                goto LAB_001e9b48;
              }
            }
          }
        }
      }
      if (in_RSI->pIdxEpr == (IndexedExpr *)0x0) {
        for (; in_RDX->op == ','; in_RDX = *(Select **)&in_RDX->selId) {
          iVar2 = pushDownWhereTerms(in_RSI,in_RDX,in_RCX,
                                     (SrcList *)CONCAT44(in_R8D,in_stack_ffffffffffffffa0),
                                     (int)((ulong)puVar4 >> 0x20));
          local_34 = iVar2 + local_34;
        }
        iVar2 = sqlite3ExprIsSingleTableConstraint
                          ((Expr *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                           (SrcList *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                           (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                           (int)in_stack_ffffffffffffff68);
        if (iVar2 != 0) {
          local_34 = local_34 + 1;
          *(uint *)((long)&in_RSI->db + 4) = *(uint *)((long)&in_RSI->db + 4) | 0x1000000;
          for (; in_RSI != (Parse *)0x0; in_RSI = (Parse *)in_RSI->aLabel) {
            memset(local_30,0xaa,0x28);
            sqlite3ExprDup((sqlite3 *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                           in_stack_ffffffffffffff68,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20)
                          );
            unsetJoinExpr((Expr *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                          in_stack_ffffffffffffff58);
            local_28._0_1_ = pParse_00->colNamesSet;
            local_28._1_1_ = pParse_00->checkSchema;
            local_28._2_1_ = pParse_00->nested;
            local_28._3_1_ = pParse_00->nTempReg;
            local_24._0_1_ = pParse_00->colNamesSet;
            local_24._1_1_ = pParse_00->checkSchema;
            local_24._2_1_ = pParse_00->nested;
            local_24._3_1_ = pParse_00->nTempReg;
            local_20 = 0;
            local_18._0_1_ = in_RSI->isMultiWrite;
            local_18._1_1_ = in_RSI->mayAbort;
            local_18._2_1_ = in_RSI->hasCompound;
            local_18._3_1_ = in_RSI->okConstFactor;
            local_18._4_1_ = in_RSI->disableLookaside;
            local_18._5_1_ = in_RSI->prepFlags;
            local_18._6_1_ = in_RSI->withinRJSubrtn;
            local_18._7_1_ = in_RSI->bHasWith;
            local_10 = findLeftmostExprlist((Select *)in_RSI);
            substExpr((SubstContext *)in_RSI,(Expr *)in_RDX);
            if (((in_RSI->constraintName).z != (char *)0x0) &&
               (iVar2 = pushDownWindowCheck((Parse *)in_stack_ffffffffffffff60,
                                            (Select *)
                                            CONCAT44(in_stack_ffffffffffffff5c,
                                                     in_stack_ffffffffffffff58),(Expr *)0x1e9aaa),
               iVar2 == 0)) {
              sqlite3ExprDelete(in_stack_ffffffffffffff60,
                                (Expr *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58
                                                ));
              local_34 = local_34 + -1;
              break;
            }
            if (((ulong)in_RSI->db & 0x800000000) == 0) {
              pEVar3 = sqlite3ExprAnd((Parse *)CONCAT44(in_stack_ffffffffffffff7c,
                                                        in_stack_ffffffffffffff78),
                                      (Expr *)CONCAT44(in_stack_ffffffffffffff74,
                                                       in_stack_ffffffffffffff70),
                                      in_stack_ffffffffffffff68);
              *(Expr **)&in_RSI->iRangeReg = pEVar3;
            }
            else {
              pEVar3 = sqlite3ExprAnd((Parse *)CONCAT44(in_stack_ffffffffffffff7c,
                                                        in_stack_ffffffffffffff78),
                                      (Expr *)CONCAT44(in_stack_ffffffffffffff74,
                                                       in_stack_ffffffffffffff70),
                                      in_stack_ffffffffffffff68);
              *(Expr **)&in_RSI->szOpAlloc = pEVar3;
            }
          }
        }
      }
      else {
        local_34 = 0;
      }
    }
    else {
      local_34 = 0;
    }
  }
  else {
    local_34 = 0;
  }
LAB_001e9b48:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_34;
}

Assistant:

static int pushDownWhereTerms(
  Parse *pParse,        /* Parse context (for malloc() and error reporting) */
  Select *pSubq,        /* The subquery whose WHERE clause is to be augmented */
  Expr *pWhere,         /* The WHERE clause of the outer query */
  SrcList *pSrcList,    /* The complete from clause of the outer query */
  int iSrc              /* Which FROM clause term to try to push into  */
){
  Expr *pNew;
  SrcItem *pSrc;        /* The subquery FROM term into which WHERE is pushed */
  int nChng = 0;
  pSrc = &pSrcList->a[iSrc];
  if( pWhere==0 ) return 0;
  if( pSubq->selFlags & (SF_Recursive|SF_MultiPart) ){
    return 0;           /* restrictions (2) and (11) */
  }
  if( pSrc->fg.jointype & (JT_LTORJ|JT_RIGHT) ){
    return 0;           /* restrictions (10) */
  }

  if( pSubq->pPrior ){
    Select *pSel;
    int notUnionAll = 0;
    for(pSel=pSubq; pSel; pSel=pSel->pPrior){
      u8 op = pSel->op;
      assert( op==TK_ALL || op==TK_SELECT
           || op==TK_UNION || op==TK_INTERSECT || op==TK_EXCEPT );
      if( op!=TK_ALL && op!=TK_SELECT ){
        notUnionAll = 1;
      }
#ifndef SQLITE_OMIT_WINDOWFUNC
      if( pSel->pWin ) return 0;    /* restriction (6b) */
#endif
    }
    if( notUnionAll ){
      /* If any of the compound arms are connected using UNION, INTERSECT,
      ** or EXCEPT, then we must ensure that none of the columns use a
      ** non-BINARY collating sequence. */
      for(pSel=pSubq; pSel; pSel=pSel->pPrior){
        int ii;
        const ExprList *pList = pSel->pEList;
        assert( pList!=0 );
        for(ii=0; ii<pList->nExpr; ii++){
          CollSeq *pColl = sqlite3ExprCollSeq(pParse, pList->a[ii].pExpr);
          if( !sqlite3IsBinary(pColl) ){
            return 0;  /* Restriction (8) */
          }
        }
      }
    }
  }else{
#ifndef SQLITE_OMIT_WINDOWFUNC
    if( pSubq->pWin && pSubq->pWin->pPartition==0 ) return 0;
#endif
  }

#ifdef SQLITE_DEBUG
  /* Only the first term of a compound can have a WITH clause.  But make
  ** sure no other terms are marked SF_Recursive in case something changes
  ** in the future.
  */
  {
    Select *pX;
    for(pX=pSubq; pX; pX=pX->pPrior){
      assert( (pX->selFlags & (SF_Recursive))==0 );
    }
  }
#endif

  if( pSubq->pLimit!=0 ){
    return 0; /* restriction (3) */
  }
  while( pWhere->op==TK_AND ){
    nChng += pushDownWhereTerms(pParse, pSubq, pWhere->pRight, pSrcList, iSrc);
    pWhere = pWhere->pLeft;
  }

#if 0 /* These checks now done by sqlite3ExprIsSingleTableConstraint() */
  if( ExprHasProperty(pWhere, EP_OuterON|EP_InnerON) /* (9a) */
   && (pSrcList->a[0].fg.jointype & JT_LTORJ)!=0     /* Fast pre-test of (9c) */
  ){
    int jj;
    for(jj=0; jj<iSrc; jj++){
      if( pWhere->w.iJoin==pSrcList->a[jj].iCursor ){
        /* If we reach this point, both (9a) and (9b) are satisfied.
        ** The following loop checks (9c):
        */
        for(jj++; jj<iSrc; jj++){
          if( (pSrcList->a[jj].fg.jointype & JT_RIGHT)!=0 ){
            return 0;  /* restriction (9) */
          }
        }
      }
    }
  }
  if( isLeftJoin
   && (ExprHasProperty(pWhere,EP_OuterON)==0
         || pWhere->w.iJoin!=iCursor)
  ){
    return 0; /* restriction (4) */
  }
  if( ExprHasProperty(pWhere,EP_OuterON)
   && pWhere->w.iJoin!=iCursor
  ){
    return 0; /* restriction (5) */
  }
#endif

#ifdef SQLITE_ALLOW_ROWID_IN_VIEW
  if( ViewCanHaveRowid && (pWhere->op==TK_ISNULL || pWhere->op==TK_NOTNULL) ){
    Expr *pLeft = pWhere->pLeft;
    if( ALWAYS(pLeft)
     && pLeft->op==TK_COLUMN
     && pLeft->iColumn < 0
    ){
      return 0;  /* Restriction (12) */
    }
  }
#endif

  if( sqlite3ExprIsSingleTableConstraint(pWhere, pSrcList, iSrc, 1) ){
    nChng++;
    pSubq->selFlags |= SF_PushDown;
    while( pSubq ){
      SubstContext x;
      pNew = sqlite3ExprDup(pParse->db, pWhere, 0);
      unsetJoinExpr(pNew, -1, 1);
      x.pParse = pParse;
      x.iTable = pSrc->iCursor;
      x.iNewTable = pSrc->iCursor;
      x.isOuterJoin = 0;
      x.pEList = pSubq->pEList;
      x.pCList = findLeftmostExprlist(pSubq);
      pNew = substExpr(&x, pNew);
#ifndef SQLITE_OMIT_WINDOWFUNC
      if( pSubq->pWin && 0==pushDownWindowCheck(pParse, pSubq, pNew) ){
        /* Restriction 6c has prevented push-down in this case */
        sqlite3ExprDelete(pParse->db, pNew);
        nChng--;
        break;
      }
#endif
      if( pSubq->selFlags & SF_Aggregate ){
        pSubq->pHaving = sqlite3ExprAnd(pParse, pSubq->pHaving, pNew);
      }else{
        pSubq->pWhere = sqlite3ExprAnd(pParse, pSubq->pWhere, pNew);
      }
      pSubq = pSubq->pPrior;
    }
  }
  return nChng;
}